

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpsend.c
# Opt level: O0

void print_usage(char *prg)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,"\nUsage: %s [options] <CAN interface>\n",in_RDI);
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"         -s <can_id>  (source can_id. Use 8 digits for extended IDs)\n");
  fprintf(_stderr,"         -d <can_id>  (destination can_id. Use 8 digits for extended IDs)\n");
  fprintf(_stderr,"         -x <addr>[:<rxaddr>]  (extended addressing / opt. separate rxaddr)\n");
  fprintf(_stderr,"         -p [tx]:[rx]  (set and enable tx/rx padding bytes)\n");
  fprintf(_stderr,"         -P <mode>     (check rx padding for (l)ength (c)ontent (a)ll)\n");
  fprintf(_stderr,"         -t <time ns>  (frame transmit time (N_As) in nanosecs) (*)\n");
  fprintf(_stderr,"         -f <time ns>  (ignore FC and force local tx stmin value in nanosecs)\n")
  ;
  fprintf(_stderr,"         -D <len>      (send a fixed PDU with len bytes - no STDIN data)\n");
  fprintf(_stderr,"         -l <num>      (send num PDUs - use \'i\' for infinite loop)\n");
  fprintf(_stderr,"         -g <usecs>    (wait given usecs before sending a PDU)\n");
  fprintf(_stderr,"         -b            (block until the PDU transmission is completed)\n");
  fprintf(_stderr,"         -S            (SF broadcast mode - for functional addressing)\n");
  fprintf(_stderr,"         -C            (CF broadcast mode - no wait for flow controls)\n");
  fprintf(_stderr,"         -L <mtu>:<tx_dl>:<tx_flags>  (link layer options for CAN FD)\n");
  fprintf(_stderr,"\nCAN IDs and addresses are given and expected in hexadecimal values.\n");
  fprintf(_stderr,"The pdu data is expected on STDIN in space separated ASCII hex values.\n");
  fprintf(_stderr,"(*) = Use \'-t %s\' to set N_As to zero for Linux version 5.18+\n","ZERO");
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "\nUsage: %s [options] <CAN interface>\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -s <can_id>  (source can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -d <can_id>  (destination can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -x <addr>[:<rxaddr>]  (extended addressing / opt. separate rxaddr)\n");
	fprintf(stderr, "         -p [tx]:[rx]  (set and enable tx/rx padding bytes)\n");
	fprintf(stderr, "         -P <mode>     (check rx padding for (l)ength (c)ontent (a)ll)\n");
	fprintf(stderr, "         -t <time ns>  (frame transmit time (N_As) in nanosecs) (*)\n");
	fprintf(stderr, "         -f <time ns>  (ignore FC and force local tx stmin value in nanosecs)\n");
	fprintf(stderr, "         -D <len>      (send a fixed PDU with len bytes - no STDIN data)\n");
	fprintf(stderr, "         -l <num>      (send num PDUs - use 'i' for infinite loop)\n");
	fprintf(stderr, "         -g <usecs>    (wait given usecs before sending a PDU)\n");
	fprintf(stderr, "         -b            (block until the PDU transmission is completed)\n");
	fprintf(stderr, "         -S            (SF broadcast mode - for functional addressing)\n");
	fprintf(stderr, "         -C            (CF broadcast mode - no wait for flow controls)\n");
	fprintf(stderr, "         -L <mtu>:<tx_dl>:<tx_flags>  (link layer options for CAN FD)\n");
	fprintf(stderr, "\nCAN IDs and addresses are given and expected in hexadecimal values.\n");
	fprintf(stderr, "The pdu data is expected on STDIN in space separated ASCII hex values.\n");
	fprintf(stderr, "(*) = Use '-t %s' to set N_As to zero for Linux version 5.18+\n", ZERO_STRING);
	fprintf(stderr, "\n");
}